

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.h
# Opt level: O0

void __thiscall
dg::sdg::DependenceGraph::DependenceGraph(DependenceGraph *this,uint id,SystemDependenceGraph *g)

{
  DGNodeArtificial *in_RDX;
  undefined4 in_ESI;
  DGFormalParameters *in_RDI;
  DependenceGraph *in_stack_ffffffffffffffd8;
  
  *(undefined4 *)&(in_RDI->super_DGParameters)._dg = in_ESI;
  *(undefined4 *)((long)&(in_RDI->super_DGParameters)._dg + 4) = 0;
  (in_RDI->super_DGParameters)._noreturn = in_RDX;
  DGFormalParameters::DGFormalParameters(in_RDI,in_stack_ffffffffffffffd8);
  std::
  vector<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>,_std::allocator<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>_>_>
  ::vector((vector<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>,_std::allocator<std::unique_ptr<dg::sdg::DGNode,_std::default_delete<dg::sdg::DGNode>_>_>_>
            *)0x13386c);
  std::
  vector<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>,_std::allocator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_>_>
  ::vector((vector<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>,_std::allocator<std::unique_ptr<dg::sdg::DGBBlock,_std::default_delete<dg::sdg::DGBBlock>_>_>_>
            *)0x13387a);
  std::
  set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
  ::set((set<dg::sdg::DGNodeCall_*,_std::less<dg::sdg::DGNodeCall_*>,_std::allocator<dg::sdg::DGNodeCall_*>_>
         *)0x133888);
  std::__cxx11::string::string((string *)(in_RDI + 3));
  return;
}

Assistant:

DependenceGraph(unsigned id, SystemDependenceGraph &g)
            : _id(id), _sdg(g), _parameters(*this) {
        assert(id > 0);
    }